

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

void __thiscall tinyxml2::MemPoolT<72>::Clear(MemPoolT<72> *this)

{
  bool bVar1;
  Block *pBVar2;
  long in_RDI;
  Block *b;
  
  while (bVar1 = DynArray<tinyxml2::MemPoolT<72>::Block_*,_10>::Empty
                           ((DynArray<tinyxml2::MemPoolT<72>::Block_*,_10> *)(in_RDI + 8)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pBVar2 = DynArray<tinyxml2::MemPoolT<72>::Block_*,_10>::Pop
                       ((DynArray<tinyxml2::MemPoolT<72>::Block_*,_10> *)(in_RDI + 8));
    if (pBVar2 != (Block *)0x0) {
      operator_delete(pBVar2);
    }
  }
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 0x70) = 0;
  *(undefined4 *)(in_RDI + 0x74) = 0;
  *(undefined4 *)(in_RDI + 0x78) = 0;
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  return;
}

Assistant:

void Clear() {
        // Delete the blocks.
        while( !_blockPtrs.Empty()) {
            Block* b  = _blockPtrs.Pop();
            delete b;
        }
        _root = 0;
        _currentAllocs = 0;
        _nAllocs = 0;
        _maxAllocs = 0;
        _nUntracked = 0;
    }